

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O3

int lws_system_cpd_start(lws_context *cx)

{
  int iVar1;
  lws_system_ops_t *plVar2;
  
  cx->captive_portal_detect = '\0';
  plVar2 = lws_system_get_ops(cx);
  if (plVar2 != (lws_system_ops_t *)0x0) {
    plVar2 = lws_system_get_ops(cx);
    if (plVar2->captive_portal_detect_request != (_func_int_lws_context_ptr *)0x0) {
      plVar2 = lws_system_get_ops(cx);
      iVar1 = (*plVar2->captive_portal_detect_request)(cx);
      return iVar1;
    }
  }
  return 0;
}

Assistant:

int
lws_system_cpd_start(struct lws_context *cx)
{
	cx->captive_portal_detect = LWS_CPD_UNKNOWN;

	/* if there's a platform implementation, use it */

	if (lws_system_get_ops(cx) &&
	    lws_system_get_ops(cx)->captive_portal_detect_request)
		return lws_system_get_ops(cx)->captive_portal_detect_request(cx);

#if defined(LWS_WITH_SECURE_STREAMS)
	/*
	 * Otherwise try to use SS "captive_portal_detect" if that's enabled
	 */
	return lws_ss_sys_cpd(cx);
#else
	return 0;
#endif
}